

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall hbm::streaming::Controller::execute(Controller *this,Value *request)

{
  bool bVar1;
  Int IVar2;
  runtime_error *prVar3;
  ostream *poVar4;
  Value *this_00;
  size_t in_RCX;
  void *in_RSI;
  ostringstream msg;
  Value *in_stack_00000238;
  Reader reader;
  Value result;
  string response;
  string requestString;
  string *in_stack_00040280;
  HttpPost *in_stack_00040288;
  Reader *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  Value *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined1 collectComments;
  Value *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  Reader *in_stack_fffffffffffffbd0;
  Reader *in_stack_fffffffffffffbe0;
  string local_3e8 [32];
  string local_3c8 [32];
  ostringstream local_3a8 [176];
  Reader *in_stack_fffffffffffffd08;
  Value *in_stack_fffffffffffffdb8;
  string local_1e8 [344];
  string local_90 [48];
  undefined1 local_60 [48];
  FastWriter local_30;
  
  collectComments = (undefined1)((ulong)in_stack_fffffffffffffbb8 >> 0x38);
  local_30.document_.field_2._8_8_ = in_RSI;
  Json::FastWriter::FastWriter((FastWriter *)in_stack_fffffffffffffba0);
  Json::FastWriter::write_abi_cxx11_
            (&local_30,(int)local_60,(void *)local_30.document_.field_2._8_8_,in_RCX);
  Json::FastWriter::~FastWriter((FastWriter *)in_stack_fffffffffffffba0);
  HttpPost::execute(in_stack_00040288,in_stack_00040280);
  Json::Value::Value(in_stack_fffffffffffffbb0,(ValueType)((ulong)in_stack_fffffffffffffba8 >> 0x20)
                    );
  Json::Reader::Reader(in_stack_fffffffffffffbe0);
  bVar1 = Json::Reader::parse(in_stack_fffffffffffffbd0,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                              in_stack_fffffffffffffbc0,(bool)collectComments);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(in_stack_fffffffffffffd08);
    std::operator+((char *)in_stack_fffffffffffffba8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::runtime_error::runtime_error(prVar3,local_1e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = Json::Value::isMember(in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
  if (!bVar1) {
    Json::Reader::~Reader(in_stack_fffffffffffffba0);
    Json::Value::~Value((Value *)in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_3a8);
  poVar4 = std::operator<<((ostream *)local_3a8,"http response contains error: code=");
  Json::Value::operator[](in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
  Json::Value::operator[](in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
  IVar2 = Json::Value::asInt(in_stack_00000238);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,IVar2);
  poVar4 = std::operator<<(poVar4," \'");
  this_00 = Json::Value::operator[](in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
  Json::Value::operator[](this_00,(char *)in_stack_fffffffffffffba8);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffffdb8);
  poVar4 = std::operator<<(poVar4,local_3c8);
  std::operator<<(poVar4,"\'");
  std::__cxx11::string::~string(local_3c8);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_3e8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Controller::execute(const Json::Value &request)
		{
			std::string requestString = Json::FastWriter().write(request);

			std::string response = m_httpPost.execute(requestString);

			Json::Value result;
			Json::Reader reader;
			if(reader.parse(response, result)==false) {
				throw std::runtime_error("http response is not valid JSON '" + reader.getFormattedErrorMessages() + "'");
			}
			if(result.isMember(ERROR)) {
				std::ostringstream msg;
				msg << "http response contains error: code=" << result[ERROR]["code"].asInt() << " '" << result[ERROR]["message"].asString() << "'";
				throw std::runtime_error(msg.str());
			}
		}